

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::ClassStatement(SQCompiler *this)

{
  long lVar1;
  SQInteger SVar2;
  SQInteger SVar3;
  bool bVar4;
  undefined7 uVar5;
  char *s;
  SQExpState es;
  
  Lex(this);
  bVar4 = (this->_es).donot_get;
  uVar5 = *(undefined7 *)&(this->_es).field_0x11;
  SVar2 = (this->_es).etype;
  SVar3 = (this->_es).epos;
  (this->_es).donot_get = true;
  PrefixedExpr(this);
  lVar1 = (this->_es).etype;
  if (lVar1 - 2U < 2) {
    ClassExp(this);
    EmitDerefOp(this,_OP_NEWSLOT);
    SQFuncState::PopTarget(this->_fs);
  }
  else {
    if (lVar1 == 1) {
      s = "invalid class name";
    }
    else {
      s = "cannot create a class in a local with the syntax(class <local>)";
    }
    Error(this,s);
  }
  (this->_es).donot_get = bVar4;
  *(undefined7 *)&(this->_es).field_0x11 = uVar5;
  (this->_es).etype = SVar2;
  (this->_es).epos = SVar3;
  return;
}

Assistant:

void ClassStatement()
    {
        SQExpState es;
        Lex();
        es = _es;
        _es.donot_get = true;
        PrefixedExpr();
        if(_es.etype == EXPR) {
            Error(_SC("invalid class name"));
        }
        else if(_es.etype == OBJECT || _es.etype == BASE) {
            ClassExp();
            EmitDerefOp(_OP_NEWSLOT);
            _fs->PopTarget();
        }
        else {
            Error(_SC("cannot create a class in a local with the syntax(class <local>)"));
        }
        _es = es;
    }